

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

bool __thiscall hgdb::json::VarStmt::operator==(VarStmt *this,VarStmt *stmt)

{
  bool bVar1;
  bool bVar2;
  
  if ((this->super_Scope<hgdb::json::VarStmt>).filename._M_string_length == 0) {
    bVar1 = true;
    if ((this->super_Scope<hgdb::json::VarStmt>).line_num.
        super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      bVar1 = (this->super_Scope<hgdb::json::VarStmt>).line_num.
              super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value == 0;
    }
  }
  else {
    bVar1 = false;
  }
  if ((stmt->super_Scope<hgdb::json::VarStmt>).filename._M_string_length == 0) {
    if ((stmt->super_Scope<hgdb::json::VarStmt>).line_num.
        super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged != true) goto LAB_0042b792;
    bVar2 = (stmt->super_Scope<hgdb::json::VarStmt>).line_num.
            super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value == 0;
  }
  else {
    bVar2 = false;
  }
  if (!(bool)(bVar1 | bVar2)) {
    bVar1 = Scope<hgdb::json::VarStmt>::operator==
                      (&this->super_Scope<hgdb::json::VarStmt>,
                       &stmt->super_Scope<hgdb::json::VarStmt>);
    if (!bVar1) {
      return false;
    }
  }
LAB_0042b792:
  bVar1 = std::operator==(&this->var_,&stmt->var_);
  return bVar1;
}

Assistant:

[[nodiscard]] bool operator==(const VarStmt &stmt) const {
        auto self_uninitialized = filename.empty() && (!line_num || (*line_num == 0));
        auto stmt_uninitialized =
            stmt.filename.empty() && (!stmt.line_num || (*stmt.line_num == 0));
        if (self_uninitialized || stmt_uninitialized) {
            return var_ == stmt.var_;
        } else {
            return Scope<VarStmt>::operator==(stmt) && var_ == stmt.var_;
        }
    }